

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void notValidDate(char *attrName)

{
  ostream *poVar1;
  invalid_argument *this;
  char *in_RDI;
  stringstream e;
  string local_1c0 [48];
  stringstream local_190 [16];
  ostream local_180 [376];
  char *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_190);
  poVar1 = std::operator<<(local_180,"The value for the ");
  poVar1 = std::operator<<(poVar1,local_8);
  std::operator<<(poVar1," attribute is not a valid date of the form \"YYYY:MM:DD yy:mm:ss\"");
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::invalid_argument::invalid_argument(this,local_1c0);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
notValidDate (const char attrName[])
{
    std::stringstream e;
    e << "The value for the " << attrName
      << " attribute is not a valid date of the form \"YYYY:MM:DD yy:mm:ss\"";
    throw invalid_argument(e.str());
}